

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

LValue * __thiscall
anon_unknown.dwarf_b1a926::LValueVisitor::visit<slang::ast::CallExpression>
          (LValueVisitor *this,CallExpression *expr,EvalContext *context)

{
  EvalContext *in_RDI;
  ConstantValue result;
  EvalContext *this_00;
  Expression *in_stack_ffffffffffffffa8;
  
  this_00 = in_RDI;
  slang::ast::Expression::eval(in_stack_ffffffffffffffa8,in_RDI);
  slang::ast::LValue::LValue((LValue *)this_00,in_RDI);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x65c125);
  return (LValue *)this_00;
}

Assistant:

LValue visit(const T& expr, EvalContext& context) {
        if constexpr (requires { expr.evalLValueImpl(context); }) {
            if (expr.bad())
                return nullptr;

            return expr.evalLValueImpl(context);
        }
        else {
            // Ensure that we get some kind of diagnostic issued here.
            auto result = expr.eval(context);
            SLANG_ASSERT(result.bad());
            return nullptr;
        }
    }